

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::ModelDescription::set_predictedfeaturename
          (ModelDescription *this,char *value)

{
  char *__s;
  LogMessage *other;
  string *default_value;
  allocator<char> local_89;
  string local_88;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  char *local_18;
  char *value_local;
  ModelDescription *this_local;
  
  local_51 = 0;
  local_18 = value;
  value_local = (char *)this;
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/../src/../build/format/Model.pb.h"
               ,0xc3b);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->predictedfeaturename_,default_value,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

inline void ModelDescription::set_predictedfeaturename(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  
  predictedfeaturename_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.ModelDescription.predictedFeatureName)
}